

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV3PosAnimationBlock(Parser *this,Animation *anim)

{
  pointer *ppaVar1;
  byte bVar2;
  char *pcVar3;
  iterator __position;
  pointer paVar4;
  byte *pbVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  uint iIndex;
  uint local_54;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *local_50;
  aiVectorKey local_48;
  
  local_50 = &anim->akeyPositions;
  iVar9 = 0;
  do {
    pcVar3 = this->filePtr;
    if (*pcVar3 == '*') {
      this->filePtr = pcVar3 + 1;
      iVar7 = strncmp("CONTROL_POS_SAMPLE",pcVar3 + 1,0x12);
      if (iVar7 == 0) {
        bVar2 = pcVar3[0x13];
        bVar6 = false;
        if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pcVar10 = pcVar3 + 0x14;
          if (bVar2 == 0) {
            pcVar10 = pcVar3 + 0x13;
          }
          this->filePtr = pcVar10;
          bVar6 = true;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        anim->mPositionType = TRACK;
      }
      pcVar3 = this->filePtr;
      iVar7 = strncmp("CONTROL_BEZIER_POS_KEY",pcVar3,0x16);
      if (iVar7 == 0) {
        bVar2 = pcVar3[0x16];
        if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pcVar10 = pcVar3 + 0x17;
          if (bVar2 == 0) {
            pcVar10 = pcVar3 + 0x16;
          }
          this->filePtr = pcVar10;
          anim->mPositionType = BEZIER;
          bVar6 = true;
        }
      }
      pcVar3 = this->filePtr;
      iVar7 = strncmp("CONTROL_TCB_POS_KEY",pcVar3,0x13);
      if (iVar7 == 0) {
        bVar2 = pcVar3[0x13];
        if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
        goto LAB_0041331d;
        pcVar10 = pcVar3 + 0x14;
        if (bVar2 == 0) {
          pcVar10 = pcVar3 + 0x13;
        }
        this->filePtr = pcVar10;
        anim->mPositionType = TCB;
      }
      else {
LAB_0041331d:
        if (!bVar6) goto LAB_004133c3;
      }
      local_48.mTime = 0.0;
      local_48.mValue.x = 0.0;
      local_48.mValue.y = 0.0;
      local_48.mValue.z = 0.0;
      __position._M_current =
           (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::_M_realloc_insert<aiVectorKey>
                  (local_50,__position,&local_48);
      }
      else {
        (__position._M_current)->mTime = 0.0;
        ((__position._M_current)->mValue).x = 0.0;
        ((__position._M_current)->mValue).y = 0.0;
        ((__position._M_current)->mValue).z = 0.0;
        ppaVar1 = &(anim->akeyPositions).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      paVar4 = (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseLV4MeshFloatTriple(this,&paVar4[-1].mValue.x,&local_54);
      paVar4[-1].mTime = (double)local_54;
    }
LAB_004133c3:
    pbVar5 = (byte *)this->filePtr;
    bVar2 = *pbVar5;
    uVar8 = (uint)bVar2;
    if (bVar2 == 0x7b) {
      iVar9 = iVar9 + 1;
    }
    else if (bVar2 == 0x7d) {
      iVar9 = iVar9 + -1;
      if (iVar9 == 0) {
        this->filePtr = (char *)(pbVar5 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar8 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *CONTROL_POS_TRACK chunk (Level 3)")
      ;
    }
    if (((uVar8 < 0xe) && ((0x3401U >> (uVar8 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar5 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3PosAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the three floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_POS_SAMPLE" ,18))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_POS_KEY" ,22))
            {
                b = true;
                anim.mPositionType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_POS_KEY" ,19))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyPositions.push_back(aiVectorKey());
                aiVectorKey& key = anim.akeyPositions.back();
                ParseLV4MeshFloatTriple(&key.mValue.x,iIndex);
                key.mTime = (double)iIndex;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_POS_TRACK");
    }
}